

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

void Pdr_QueuePush(Pdr_Man_t *p,Pdr_Obl_t *pObl)

{
  Pdr_Obl_t *pPVar1;
  int iVar2;
  Pdr_Obl_t *pPVar3;
  Pdr_Obl_t **ppPVar4;
  
  p->nObligs = p->nObligs + 1;
  iVar2 = p->nQueCur + 1;
  p->nQueCur = iVar2;
  if (iVar2 < p->nQueMax) {
    iVar2 = p->nQueMax;
  }
  p->nQueMax = iVar2;
  pObl->nRefs = pObl->nRefs + 1;
  pPVar3 = p->pQueue;
  ppPVar4 = &p->pQueue;
  if (pPVar3 == (Pdr_Obl_t *)0x0) {
    *ppPVar4 = pObl;
    return;
  }
  iVar2 = pPVar3->iFrame;
  while( true ) {
    if ((pObl->iFrame < iVar2) || ((iVar2 == pObl->iFrame && (pObl->prio < pPVar3->prio))))
    goto LAB_005fa178;
    pPVar1 = pPVar3->pLink;
    ppPVar4 = &pPVar3->pLink;
    if (pPVar1 == (Pdr_Obl_t *)0x0) break;
    iVar2 = pPVar1->iFrame;
    pPVar3 = pPVar1;
  }
  pPVar3 = (Pdr_Obl_t *)0x0;
LAB_005fa178:
  *ppPVar4 = pObl;
  pObl->pLink = pPVar3;
  return;
}

Assistant:

void Pdr_QueuePush( Pdr_Man_t * p, Pdr_Obl_t * pObl )
{
    Pdr_Obl_t * pTemp, ** ppPrev;
    p->nObligs++;
    p->nQueCur++;
    p->nQueMax = Abc_MaxInt( p->nQueMax, p->nQueCur );
    Pdr_OblRef( pObl );
    if ( p->pQueue == NULL )
    {
        p->pQueue = pObl;
        return;
    }
    for ( ppPrev = &p->pQueue, pTemp = p->pQueue; pTemp; ppPrev = &pTemp->pLink, pTemp = pTemp->pLink )
        if ( pTemp->iFrame > pObl->iFrame || (pTemp->iFrame == pObl->iFrame && pTemp->prio > pObl->prio) )
            break;
    *ppPrev = pObl;
    pObl->pLink = pTemp;
}